

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void P_UnPredictPlayer(void)

{
  undefined4 uVar1;
  APlayerPawn *this;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 aVar2;
  sector_t *psVar3;
  AActor *pAVar4;
  sector_t_conflict **ppsVar5;
  AActor **ppAVar6;
  msecnode_t **ppmVar7;
  long lVar8;
  long lVar9;
  AActor **ppAVar10;
  FBlockNode *pFVar11;
  ulong uVar12;
  AActor *pAVar13;
  msecnode_t *pmVar14;
  msecnode_t *pmVar15;
  msecnode_t **ppmVar16;
  msecnode_t *pmVar17;
  long lVar18;
  FLinkContext local_38;
  
  lVar8 = (long)consoleplayer;
  lVar9 = lVar8 * 0x2a0;
  if ((*(byte *)((long)&DAT_017e1f28 + lVar9 + 1) & 0x20) == 0) {
    return;
  }
  this = ((player_t *)(&players + lVar8 * 0x54))->mo;
  lVar18 = (&DAT_017e1fb8)[lVar8 * 0x54];
  if (lVar18 != 0) {
    if ((*(byte *)(lVar18 + 0x20) & 0x20) == 0) goto LAB_0046b101;
    (&DAT_017e1fb8)[lVar8 * 0x54] = 0;
  }
  lVar18 = 0;
LAB_0046b101:
  aVar2 = (this->InvSel).field_0;
  uVar1 = *(undefined4 *)(&DAT_017e1edc + lVar9);
  player_t::operator=((player_t *)(&players + lVar8 * 0x54),&PredictionPlayerBackup);
  (&DAT_017e1fb8)[lVar8 * 0x54] = lVar18;
  local_38.sector_list = (msecnode_t *)0x0;
  local_38.render_list = (msecnode_t *)0x0;
  AActor::UnlinkFromWorld(&this->super_AActor,&local_38);
  memcpy(&(this->super_AActor).snext,PredictionActorBackup,0x530);
  if (((this->super_AActor).flags.Value & 8) == 0) {
    psVar3 = (this->super_AActor).Sector;
    psVar3->thinglist = (AActor *)0x0;
    ppAVar6 = PredictionSectorListBackup.Array;
    uVar12 = (ulong)PredictionSectorListBackup.Count;
    pmVar14 = local_38.sector_list;
    if (uVar12 != 0) {
      ppAVar10 = &psVar3->thinglist;
      pAVar13 = (AActor *)0x0;
      do {
        pAVar4 = ppAVar6[uVar12 - 1];
        pAVar4->snext = pAVar13;
        if (pAVar13 != (AActor *)0x0) {
          pAVar13->sprev = &pAVar4->snext;
        }
        pAVar4->sprev = ppAVar10;
        *ppAVar10 = pAVar4;
        uVar12 = uVar12 - 1;
        pAVar13 = pAVar4;
      } while (uVar12 != 0);
    }
    for (; pmVar14 != (msecnode_t *)0x0; pmVar14 = pmVar14->m_tnext) {
      pmVar14->m_thing = (AActor *)0x0;
    }
    P_DelSeclist(local_38.sector_list,0x1c0);
    local_38.sector_list = (msecnode_t *)0x0;
    uVar12 = (ulong)PredictionTouchingSectorsBackup.Count;
    if (uVar12 == 0) {
      (this->super_AActor).touching_sectorlist = (msecnode_t *)0x0;
    }
    else {
      do {
        local_38.sector_list =
             P_AddSecnode(PredictionTouchingSectorsBackup.Array[uVar12 - 1],&this->super_AActor,
                          local_38.sector_list,
                          &PredictionTouchingSectorsBackup.Array[uVar12 - 1]->touching_thinglist);
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      uVar12 = (ulong)PredictionTouchingSectorsBackup.Count;
      (this->super_AActor).touching_sectorlist = local_38.sector_list;
      ppmVar7 = PredictionSector_sprev_Backup.Array;
      ppsVar5 = PredictionTouchingSectorsBackup.Array;
joined_r0x0046b229:
      if (uVar12 != 0) {
        lVar8 = uVar12 - 1;
        uVar12 = uVar12 - 1;
        if (ppmVar7[lVar8] != (msecnode_t *)0x0) {
          for (pmVar14 = ppsVar5[uVar12]->touching_thinglist; pmVar14 != (msecnode_t *)0x0;
              pmVar14 = pmVar14->m_snext) {
            if ((APlayerPawn *)pmVar14->m_thing == this) {
              pmVar15 = pmVar14->m_sprev;
              if (pmVar15 == (msecnode_t *)0x0) {
                ppmVar16 = &pmVar14->m_sector->touching_thinglist;
              }
              else {
                ppmVar16 = &pmVar15->m_snext;
              }
              pmVar17 = pmVar14->m_snext;
              *ppmVar16 = pmVar17;
              if (pmVar17 != (msecnode_t *)0x0) {
                pmVar17->m_sprev = pmVar15;
              }
              pmVar15 = ppmVar7[uVar12];
              pmVar14->m_sprev = pmVar15;
              if (pmVar15->m_snext == (msecnode_t *)0x0) {
                pmVar17 = (msecnode_t *)0x0;
              }
              else {
                pmVar15->m_snext->m_sprev = pmVar14;
                pmVar15 = pmVar14->m_sprev;
                pmVar17 = pmVar15->m_snext;
              }
              pmVar14->m_snext = pmVar17;
              pmVar15->m_snext = pmVar14;
              break;
            }
          }
        }
        goto joined_r0x0046b229;
      }
    }
  }
  for (pFVar11 = (this->super_AActor).BlockNode; pFVar11 != (FBlockNode *)0x0;
      pFVar11 = pFVar11->NextBlock) {
    *pFVar11->PrevActor = pFVar11;
    if (pFVar11->NextActor != (FBlockNode *)0x0) {
      pFVar11->NextActor->PrevActor = &pFVar11->NextActor;
    }
  }
  (this->InvSel).field_0 = aVar2;
  *(undefined4 *)(&DAT_017e1edc + lVar9) = uVar1;
  return;
}

Assistant:

void P_UnPredictPlayer ()
{
	player_t *player = &players[consoleplayer];

	if (player->cheats & CF_PREDICTING)
	{
		unsigned int i;
		APlayerPawn *act = player->mo;
		AActor *savedcamera = player->camera;

		TObjPtr<AInventory> InvSel = act->InvSel;
		int inventorytics = player->inventorytics;

		*player = PredictionPlayerBackup;

		// Restore the camera instead of using the backup's copy, because spynext/prev
		// could cause it to change during prediction.
		player->camera = savedcamera;

		FLinkContext ctx;
		act->UnlinkFromWorld(&ctx);
		memcpy(&act->snext, PredictionActorBackup, sizeof(APlayerPawn) - ((BYTE *)&act->snext - (BYTE *)act));

		// The blockmap ordering needs to remain unchanged, too.
		// Restore sector links and refrences.
		// [ED850] This is somewhat of a duplicate of LinkToWorld(), but we need to keep every thing the same,
		// otherwise we end up fixing bugs in blockmap logic (i.e undefined behaviour with polyobject collisions),
		// which we really don't want to do here.
		if (!(act->flags & MF_NOSECTOR))
		{
			sector_t *sec = act->Sector;
			AActor *me, *next;
			AActor **link;// , **prev;

			// The thinglist is just a pointer chain. We are restoring the exact same things, so we can NULL the head safely
			sec->thinglist = NULL;

			for (i = PredictionSectorListBackup.Size(); i-- > 0;)
			{
				me = PredictionSectorListBackup[i];
				link = &sec->thinglist;
				next = *link;
				if ((me->snext = next))
					next->sprev = &me->snext;
				me->sprev = link;
				*link = me;
			}

			// Destroy old refrences
			msecnode_t *node = ctx.sector_list;
			while (node)
			{
				node->m_thing = NULL;
				node = node->m_tnext;
			}

			// Make the sector_list match the player's touching_sectorlist before it got predicted.
			P_DelSeclist(ctx.sector_list, &sector_t::touching_thinglist);
			ctx.sector_list = NULL;
			for (i = PredictionTouchingSectorsBackup.Size(); i-- > 0;)
			{
				ctx.sector_list = P_AddSecnode(PredictionTouchingSectorsBackup[i], act, ctx.sector_list, PredictionTouchingSectorsBackup[i]->touching_thinglist);
			}
			act->touching_sectorlist = ctx.sector_list;	// Attach to thing
			ctx.sector_list = NULL;		// clear for next time

			// Huh???
			node = ctx.sector_list;
			while (node)
			{
				if (node->m_thing == NULL)
				{
					if (node == ctx.sector_list)
						ctx.sector_list = node->m_tnext;
					node = P_DelSecnode(node, &sector_t::touching_thinglist);
				}
				else
				{
					node = node->m_tnext;
				}
			}

			msecnode_t *snode;

			// Restore sector thinglist order
			for (i = PredictionTouchingSectorsBackup.Size(); i-- > 0;)
			{
				// If we were already the head node, then nothing needs to change
				if (PredictionSector_sprev_Backup[i] == NULL)
					continue;

				for (snode = PredictionTouchingSectorsBackup[i]->touching_thinglist; snode; snode = snode->m_snext)
				{
					if (snode->m_thing == act)
					{
						if (snode->m_sprev)
							snode->m_sprev->m_snext = snode->m_snext;
						else
							snode->m_sector->touching_thinglist = snode->m_snext;
						if (snode->m_snext)
							snode->m_snext->m_sprev = snode->m_sprev;

						snode->m_sprev = PredictionSector_sprev_Backup[i];

						// At the moment, we don't exist in the list anymore, but we do know what our previous node is, so we set its current m_snext->m_sprev to us.
						if (snode->m_sprev->m_snext)
							snode->m_sprev->m_snext->m_sprev = snode;
						snode->m_snext = snode->m_sprev->m_snext;
						snode->m_sprev->m_snext = snode;
						break;
					}
				}
			}
		}

		// Now fix the pointers in the blocknode chain
		FBlockNode *block = act->BlockNode;

		while (block != NULL)
		{
			*(block->PrevActor) = block;
			if (block->NextActor != NULL)
			{
				block->NextActor->PrevActor = &block->NextActor;
			}
			block = block->NextBlock;
		}

		act->InvSel = InvSel;
		player->inventorytics = inventorytics;
	}
}